

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Cluster::AddFrame
          (Cluster *this,uint8_t *data,uint64_t length,uint64_t track_number,uint64_t abs_timecode,
          bool is_key)

{
  bool bVar1;
  bool bVar2;
  Frame frame;
  Frame local_98;
  
  local_98.frame_ = (uint8_t *)0x0;
  bVar2 = false;
  local_98.is_key_ = false;
  local_98.add_id_ = 0;
  local_98.additional_ = (uint8_t *)0x0;
  local_98.additional_length_ = 0;
  local_98.duration_ = 0;
  local_98.duration_set_ = false;
  local_98.length_ = 0;
  local_98.track_number_ = 0;
  local_98.timestamp_ = 0;
  local_98.discard_padding_._0_1_ = 0;
  local_98.discard_padding_._1_7_ = 0;
  local_98.reference_block_timestamp_._0_1_ = 0;
  local_98._89_8_ = 0;
  bVar1 = Frame::Init(&local_98,data,length);
  if (bVar1) {
    local_98.is_key_ = is_key;
    local_98.track_number_ = track_number;
    local_98.timestamp_ = abs_timecode;
    bVar2 = QueueOrWriteFrame(this,&local_98);
  }
  Frame::~Frame(&local_98);
  return bVar2;
}

Assistant:

bool Cluster::AddFrame(const uint8_t* data, uint64_t length,
                       uint64_t track_number, uint64_t abs_timecode,
                       bool is_key) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}